

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_get_advances(FT_Face ttface,FT_UInt start,FT_UInt count,FT_Int32 flags,
                        FT_Fixed *advances)

{
  ushort local_48;
  FT_Short local_46;
  ushort local_44;
  FT_Short local_42;
  FT_UShort aw;
  FT_Short lsb;
  FT_UShort ah;
  FT_Short tsb;
  TT_Face face;
  FT_Fixed *pFStack_30;
  FT_UInt nn;
  FT_Fixed *advances_local;
  uint local_20;
  FT_Int32 flags_local;
  FT_UInt count_local;
  FT_UInt start_local;
  FT_Face ttface_local;
  
  _aw = (TT_Face)ttface;
  pFStack_30 = advances;
  advances_local._4_4_ = flags;
  local_20 = count;
  flags_local = start;
  _count_local = ttface;
  if ((flags & 0x10U) == 0) {
    if ((((ttface->face_index & 0x7fff0000U) != 0) || ((ttface->face_flags & 0x8000U) != 0)) &&
       (((ulong)ttface[4].extensions & 2) == 0)) {
      return 7;
    }
    for (face._4_4_ = 0; face._4_4_ < local_20; face._4_4_ = face._4_4_ + 1) {
      TT_Get_HMetrics(_aw,flags_local + face._4_4_,&local_46,&local_48);
      pFStack_30[face._4_4_] = (ulong)local_48;
    }
  }
  else {
    if ((((ttface->face_index & 0x7fff0000U) != 0) || ((ttface->face_flags & 0x8000U) != 0)) &&
       (((ulong)ttface[4].extensions & 0x10) == 0)) {
      return 7;
    }
    for (face._4_4_ = 0; face._4_4_ < local_20; face._4_4_ = face._4_4_ + 1) {
      TT_Get_VMetrics(_aw,flags_local + face._4_4_,0,&local_42,&local_44);
      pFStack_30[face._4_4_] = (ulong)local_44;
    }
  }
  return 0;
}

Assistant:

static FT_Error
  tt_get_advances( FT_Face    ttface,
                   FT_UInt    start,
                   FT_UInt    count,
                   FT_Int32   flags,
                   FT_Fixed  *advances )
  {
    FT_UInt  nn;
    TT_Face  face = (TT_Face)ttface;


    /* XXX: TODO: check for sbits */

    if ( flags & FT_LOAD_VERTICAL_LAYOUT )
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* no fast retrieval for blended MM fonts without VVAR table */
      if ( ( FT_IS_NAMED_INSTANCE( ttface ) || FT_IS_VARIATION( ttface ) ) &&
           !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )        )
        return FT_THROW( Unimplemented_Feature );
#endif

      for ( nn = 0; nn < count; nn++ )
      {
        FT_Short   tsb;
        FT_UShort  ah;


        /* since we don't need `tsb', we use zero for `yMax' parameter */
        TT_Get_VMetrics( face, start + nn, 0, &tsb, &ah );
        advances[nn] = ah;
      }
    }
    else
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* no fast retrieval for blended MM fonts without HVAR table */
      if ( ( FT_IS_NAMED_INSTANCE( ttface ) || FT_IS_VARIATION( ttface ) ) &&
           !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )        )
        return FT_THROW( Unimplemented_Feature );
#endif

      for ( nn = 0; nn < count; nn++ )
      {
        FT_Short   lsb;
        FT_UShort  aw;


        TT_Get_HMetrics( face, start + nn, &lsb, &aw );
        advances[nn] = aw;
      }
    }

    return FT_Err_Ok;
  }